

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

void extent_destroy_wrapper
               (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,extent_t *extent)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  void *addr;
  extent_t *in_RCX;
  long *in_RDX;
  long in_RDI;
  tsd_t *tsd;
  uint8_t state;
  extent_t *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  arena_t *in_stack_ffffffffffffff70;
  arena_t *in_stack_ffffffffffffff78;
  tsdn_t *in_stack_ffffffffffffff80;
  witness_tsdn_t *local_38;
  
  if (in_RDI == 0) {
    local_38 = (witness_tsdn_t *)0x0;
  }
  else {
    local_38 = (witness_tsdn_t *)(in_RDI + 0x1838);
  }
  witness_assert_depth_to_rank(local_38,0xc,0);
  extent_deregister((tsdn_t *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff58);
  addr = extent_base_get(in_RCX);
  extent_addr_set(in_RCX,addr);
  extent_hooks_assure_initialized
            ((arena_t *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             (extent_hooks_t **)in_stack_ffffffffffffff58);
  if ((extent_hooks_t *)*in_RDX == &extent_hooks_default) {
    extent_base_get(in_RCX);
    extent_size_get(in_RCX);
    extent_destroy_default_impl
              ((void *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               (size_t)in_stack_ffffffffffffff58);
  }
  else if (*(long *)(*in_RDX + 0x10) != 0) {
    extent_hook_pre_reentrancy((tsdn_t *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff80 = *(tsdn_t **)(*in_RDX + 0x10);
    lVar1 = *in_RDX;
    in_stack_ffffffffffffff70 = (arena_t *)extent_base_get(in_RCX);
    in_stack_ffffffffffffff78 = (arena_t *)extent_size_get(in_RCX);
    bVar2 = extent_committed_get(in_RCX);
    uVar3 = arena_ind_get((arena_t *)0x167ea5);
    (*(code *)in_stack_ffffffffffffff80)
              (lVar1,in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,bVar2 & 1,uVar3);
    extent_hook_post_reentrancy((tsdn_t *)CONCAT17(bVar2,in_stack_ffffffffffffff60));
  }
  extent_dalloc(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                (extent_t *)in_stack_ffffffffffffff70);
  return;
}

Assistant:

void
extent_destroy_wrapper(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, extent_t *extent) {
	assert(extent_base_get(extent) != NULL);
	assert(extent_size_get(extent) != 0);
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	/* Deregister first to avoid a race with other allocating threads. */
	extent_deregister(tsdn, extent);

	extent_addr_set(extent, extent_base_get(extent));

	extent_hooks_assure_initialized(arena, r_extent_hooks);
	/* Try to destroy; silently fail otherwise. */
	if (*r_extent_hooks == &extent_hooks_default) {
		/* Call directly to propagate tsdn. */
		extent_destroy_default_impl(extent_base_get(extent),
		    extent_size_get(extent));
	} else if ((*r_extent_hooks)->destroy != NULL) {
		extent_hook_pre_reentrancy(tsdn, arena);
		(*r_extent_hooks)->destroy(*r_extent_hooks,
		    extent_base_get(extent), extent_size_get(extent),
		    extent_committed_get(extent), arena_ind_get(arena));
		extent_hook_post_reentrancy(tsdn);
	}

	extent_dalloc(tsdn, arena, extent);
}